

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_anomaly_test.cc
# Opt level: O0

fdb_compact_decision
cb_compact(fdb_file_handle *fhandle,fdb_compaction_status status,char *kv_name,fdb_doc *doc,
          uint64_t old_offset,uint64_t new_offset,void *ctx)

{
  long in_RCX;
  long in_RDX;
  int in_ESI;
  char value [256];
  char key [256];
  fdb_compact_decision ret;
  fdb_status fs;
  cb_cmp_args *args;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  fdb_file_handle *in_stack_fffffffffffffd68;
  size_t in_stack_fffffffffffffd88;
  void *in_stack_fffffffffffffd90;
  size_t in_stack_fffffffffffffd98;
  void *in_stack_fffffffffffffda0;
  fdb_kvs_handle *in_stack_fffffffffffffda8;
  char local_198 [264];
  fdb_compact_decision local_90;
  fdb_status local_8c;
  long local_88;
  __time_t local_60;
  __suseconds_t local_58;
  timeval local_40 [2];
  long local_20;
  long local_18;
  int local_c;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_c = in_ESI;
  gettimeofday(local_40,(__timezone_ptr_t)0x0);
  local_60 = local_40[0].tv_sec;
  local_58 = local_40[0].tv_usec;
  local_88 = value._8_8_;
  local_90 = 0;
  if (local_c == 2) {
    if (local_18 == 0) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
              ,0x1ff);
      cb_compact::__test_pass = 0;
      if (local_18 == 0) {
        __assert_fail("kv_name",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                      ,0x1ff,
                      "fdb_compact_decision cb_compact(fdb_file_handle *, fdb_compaction_status, const char *, fdb_doc *, uint64_t, uint64_t, void *)"
                     );
      }
    }
    *(int *)(local_88 + 0xc) = *(int *)(local_88 + 0xc) + 1;
    if ((*(byte *)(local_20 + 0x48) & 1) != 0) {
      local_90 = 1;
    }
    if (*(int *)(local_88 + 0xc) == *(int *)(local_88 + 8) + -1) {
      sprintf(local_198,"key%250d",(ulong)*(uint *)(local_88 + 8));
      sprintf(&stack0xfffffffffffffd68,"body%250d",(ulong)*(uint *)(local_88 + 8));
      local_8c = fdb_set_kv(in_stack_fffffffffffffda8,in_stack_fffffffffffffda0,
                            in_stack_fffffffffffffd98,in_stack_fffffffffffffd90,
                            in_stack_fffffffffffffd88);
      if (local_8c != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                ,0x20a);
        cb_compact::__test_pass = 0;
        if (local_8c != FDB_RESULT_SUCCESS) {
          __assert_fail("fs == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                        ,0x20a,
                        "fdb_compact_decision cb_compact(fdb_file_handle *, fdb_compaction_status, const char *, fdb_doc *, uint64_t, uint64_t, void *)"
                       );
        }
      }
      local_8c = fdb_commit(in_stack_fffffffffffffd68,'\0');
      if (local_8c != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                ,0x20c);
        cb_compact::__test_pass = 0;
        if (local_8c != FDB_RESULT_SUCCESS) {
          __assert_fail("fs == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                        ,0x20c,
                        "fdb_compact_decision cb_compact(fdb_file_handle *, fdb_compaction_status, const char *, fdb_doc *, uint64_t, uint64_t, void *)"
                       );
        }
      }
      sprintf(local_198,"zzz%250d",(ulong)*(uint *)(local_88 + 8));
      local_8c = fdb_set_kv(in_stack_fffffffffffffda8,in_stack_fffffffffffffda0,
                            in_stack_fffffffffffffd98,in_stack_fffffffffffffd90,
                            in_stack_fffffffffffffd88);
      if (local_8c != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                ,0x210);
        cb_compact::__test_pass = 0;
        if (local_8c != FDB_RESULT_SUCCESS) {
          __assert_fail("fs == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                        ,0x210,
                        "fdb_compact_decision cb_compact(fdb_file_handle *, fdb_compaction_status, const char *, fdb_doc *, uint64_t, uint64_t, void *)"
                       );
        }
      }
    }
  }
  return local_90;
}

Assistant:

static fdb_compact_decision cb_compact(fdb_file_handle *fhandle,
                            fdb_compaction_status status, const char *kv_name,
                            fdb_doc *doc, uint64_t old_offset,
                            uint64_t new_offset, void *ctx)
{
    TEST_INIT();
    struct cb_cmp_args *args = (struct cb_cmp_args *)ctx;
    fdb_status fs;
    fdb_compact_decision ret = FDB_CS_KEEP_DOC;
    (void) fhandle;
    (void) doc;
    (void) old_offset;
    (void) new_offset;

    if (status == FDB_CS_MOVE_DOC) {
        TEST_CHK(kv_name);
        args->nmoves++;
        if (doc->deleted) {
            ret = FDB_CS_DROP_DOC;
        }
        if (args->nmoves == args->ndocs - 1) {
            char key[256], value[256];
            // phase 3 of compaction - uncommitted docs in old_file
            sprintf(key, "key%250d", args->ndocs);
            sprintf(value, "body%250d", args->ndocs);
            fs = fdb_set_kv(args->handle, key, 253, value, 254);
            TEST_CHK(fs == FDB_RESULT_SUCCESS);
            fs = fdb_commit(args->handle->fhandle, FDB_COMMIT_NORMAL);
            TEST_CHK(fs == FDB_RESULT_SUCCESS);

            sprintf(key, "zzz%250d", args->ndocs);
            fs = fdb_set_kv(args->handle, key, 253, value, 254);
            TEST_CHK(fs == FDB_RESULT_SUCCESS);
        }
    }

    return ret;
}